

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O3

void __thiscall
test_matrix_dense_matrix_matrix_multiplication_assignment_Test::TestBody
          (test_matrix_dense_matrix_matrix_multiplication_assignment_Test *this)

{
  initializer_list<double> *piVar1;
  void *pvVar2;
  bool bVar3;
  pointer pVVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  char *pcVar9;
  double dVar10;
  bool bVar11;
  initializer_list<double> *piVar12;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  long lVar13;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> *piVar14;
  pointer *__ptr;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long lVar16;
  initializer_list<double> *piVar17;
  Vector_Dense<double,_2UL> *pVVar18;
  Matrix_Dense<double,_2UL,_3UL> incorrect;
  DeathTest *gtest_dt;
  undefined1 local_238 [16];
  pointer local_228;
  undefined8 uStack_220;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_218;
  long lStack_200;
  undefined1 local_1f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1f0;
  undefined1 local_1e8 [16];
  double local_1d8;
  double dStack_1d0;
  Vector_Dense<double,_0UL> local_1c8;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_1a8;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_188;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> local_168;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> local_158;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_148;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_128;
  Matrix_Dense<double,_2UL,_2UL> local_108;
  initializer_list<double> local_e8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_88;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_70;
  double local_58 [3];
  initializer_list<double> local_40;
  
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[0] = (double)local_238;
  local_238._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x3ff0000000000000;
  local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4000000000000000;
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[1] = 9.88131291682493e-324;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)local_1f8,(initializer_list<double> *)&local_108);
  local_188.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  local_188.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4010000000000000;
  local_218.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_218.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_188;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)(local_1e8 + 8),(initializer_list<double> *)&local_218);
  local_168._M_len = 2;
  local_168._M_array = (Vector_Dense<double,_0UL> *)local_1f8;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_1a8,&local_168);
  piVar1 = (initializer_list<double> *)
           (local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
            super_array<double,_2UL>._M_elems + 1);
  lVar13 = 0x30;
  do {
    pvVar2 = *(void **)((long)&local_218.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar13);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&lStack_200 + lVar13) - (long)pvVar2);
    }
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != 0);
  local_238._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x4014000000000000;
  local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4018000000000000;
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[1] = 9.88131291682493e-324;
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[0] = (double)local_238;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)local_1f8,(initializer_list<double> *)&local_108);
  local_188.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x401c000000000000;
  local_188.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4020000000000000;
  local_218.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_218.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_188;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)(local_1e8 + 8),(initializer_list<double> *)&local_218);
  local_168._M_len = 2;
  local_168._M_array = (Vector_Dense<double,_0UL> *)local_1f8;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_148,&local_168);
  lVar13 = 0x30;
  do {
    pvVar2 = *(void **)((long)&local_218.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar13);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&lStack_200 + lVar13) - (long)pvVar2);
    }
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != 0);
  local_238._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x3ff0000000000000;
  local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4000000000000000;
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[1] = 9.88131291682493e-324;
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[0] = (double)local_238;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1f8,(initializer_list<double> *)&local_108);
  local_188.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  local_188.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4010000000000000;
  local_218.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_218.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_188;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1e8,(initializer_list<double> *)&local_218);
  local_158._M_array = (iterator)local_1e8._0_8_;
  local_158._M_len = local_1e8._8_8_;
  local_168._M_array = (iterator)local_1f8;
  local_168._M_len = (size_type)pbStack_1f0;
  local_218.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4014000000000000;
  local_218.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4018000000000000;
  local_238._0_8_ = &local_218;
  local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1f8,(initializer_list<double> *)local_238);
  local_188.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_128;
  local_128.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x401c000000000000;
  local_128.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4020000000000000;
  local_188.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1e8,(initializer_list<double> *)&local_188);
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].super_array<double,_2UL>.
  _M_elems[0] = (double)local_1e8._0_8_;
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].super_array<double,_2UL>.
  _M_elems[1] = (double)local_1e8._8_8_;
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[0] = (double)local_1f8;
  local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[1] = (double)pbStack_1f0;
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)&local_1a8,(Matrix_Dense<double,_0UL,_0UL> *)&local_148
            );
  local_1e8._0_8_ = local_158._M_array;
  local_1e8._8_8_ = local_158._M_len;
  local_1f8 = (undefined1  [8])local_168._M_array;
  pbStack_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_168._M_len;
  local_168._M_array = (iterator)0x0;
  local_168._M_len = 0;
  local_158._M_array = (iterator)0x0;
  local_158._M_len = 0;
  piVar14 = &local_168;
  pVVar18 = (Vector_Dense<double,_2UL> *)local_1f8;
  bVar6 = true;
LAB_001143e3:
  bVar11 = true;
  lVar13 = 0;
  piVar12 = (initializer_list<double> *)&local_108;
  do {
    lVar16 = 0;
    piVar17 = (initializer_list<double> *)&local_108;
    bVar5 = true;
    do {
      while (bVar3 = bVar5, !bVar11) {
        (&piVar14->_M_array)[lVar16] =
             (iterator)
             ((pVVar18->super_array<double,_2UL>)._M_elems[lVar13] *
              (double)(&piVar12->_M_array)[lVar16] + (double)(&piVar14->_M_array)[lVar16]);
        lVar16 = 1;
        piVar17 = piVar1;
        bVar5 = false;
        if (!bVar3) {
          bVar11 = !bVar6;
          piVar14 = &local_158;
          pVVar18 = (Vector_Dense<double,_2UL> *)local_1e8;
          bVar6 = false;
          if (bVar11) {
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[0][0]","19",
                       **(double **)
                         local_1a8.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,19.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0xfb,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )local_238._0_8_ !=
                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[0][1]","22",
                       *(double *)
                        ((long)*(double *)
                                local_1a8.
                                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 8),22.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0xfc,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[1][0]","43",
                       **(double **)
                         ((long)local_1a8.
                                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x18),43.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0xfd,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[1][1]","50",
                       *(double *)
                        ((long)*(double *)
                                ((long)local_1a8.
                                       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 0x18) + 8),50.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0xfe,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"static_matrix_0[0][0]","19",(double)local_168._M_array
                       ,19.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0xff,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"static_matrix_0[0][1]","22",(double)local_168._M_len,
                       22.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x100,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"static_matrix_0[1][0]","43",(double)local_158._M_array
                       ,43.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x101,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"static_matrix_0[1][1]","50",(double)local_158._M_len,
                       50.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x102,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            local_d8._0_8_ = (iterator)0x3ff0000000000000;
            local_d8._8_8_ = (pointer)0x4000000000000000;
            local_128.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
            local_128.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8;
            Disa::Vector_Dense<double,_0UL>::Vector_Dense
                      ((Vector_Dense<double,_0UL> *)local_1f8,(initializer_list<double> *)&local_128
                      );
            local_e8._M_array = (iterator)0x4008000000000000;
            local_e8._M_len = 0x4010000000000000;
            local_c0 = 2;
            local_d8._16_8_ = &local_e8;
            Disa::Vector_Dense<double,_0UL>::Vector_Dense
                      ((Vector_Dense<double,_0UL> *)(local_1e8 + 8),
                       (initializer_list<double> *)(local_d8 + 0x10));
            local_188.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
            local_188.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (Vector_Dense<double,_0UL> *)local_1f8;
            Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
                      ((Matrix_Dense<double,_0UL,_0UL> *)&local_218,
                       (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)&local_188);
            local_228 = local_1a8.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_238._8_8_ =
                 local_1a8.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_238._0_8_ =
                 local_1a8.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1a8.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_218.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1a8.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_218.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1a8.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_218.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::~vector((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                       *)local_238);
            std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::~vector(&local_218);
            lVar13 = 0x30;
            do {
              pvVar2 = *(void **)((long)&local_218.
                                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + lVar13);
              if (pvVar2 != (void *)0x0) {
                operator_delete(pvVar2,*(long *)((long)&lStack_200 + lVar13) - (long)pvVar2);
              }
              lVar13 = lVar13 + -0x18;
            } while (lVar13 != 0);
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
            local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
            local_238._0_8_ = &local_218;
            Disa::Vector_Dense<double,_2UL>::Vector_Dense
                      ((Vector_Dense<double,_2UL> *)local_1f8,(initializer_list<double> *)local_238)
            ;
            local_128.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
            local_128.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4010000000000000;
            local_188.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
            local_188.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_128;
            Disa::Vector_Dense<double,_2UL>::Vector_Dense
                      ((Vector_Dense<double,_2UL> *)local_1e8,(initializer_list<double> *)&local_188
                      );
            local_158._M_array = (iterator)local_1e8._0_8_;
            local_158._M_len = local_1e8._8_8_;
            local_168._M_array = (iterator)local_1f8;
            local_168._M_len = (size_type)pbStack_1f0;
            Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                      ((Matrix_Dense<double,0ul,0ul> *)&local_1a8,&local_108);
            Disa::Matrix_Dense<double,2ul,2ul>::operator*=
                      ((Matrix_Dense<double,2ul,2ul> *)&local_168,
                       (Matrix_Dense<double,_0UL,_0UL> *)&local_148);
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[0][0]","19",
                       **(double **)
                         local_1a8.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,19.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x109,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[0][1]","22",
                       *(double *)
                        ((long)*(double *)
                                local_1a8.
                                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 8),22.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x10a,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[1][0]","43",
                       **(double **)
                         ((long)local_1a8.
                                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x18),43.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x10b,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )local_238._0_8_ !=
                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[1][1]","50",
                       *(double *)
                        ((long)*(double *)
                                ((long)local_1a8.
                                       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 0x18) + 8),50.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x10c,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"static_matrix_0[0][0]","19",(double)local_168._M_array
                       ,19.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x10d,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"static_matrix_0[0][1]","22",(double)local_168._M_len,
                       22.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x10e,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"static_matrix_0[1][0]","43",(double)local_158._M_array
                       ,43.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x10f,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"static_matrix_0[1][1]","50",(double)local_158._M_len,
                       50.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x110,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            local_d8._0_8_ = (iterator)0x3ff0000000000000;
            local_d8._8_8_ = (pointer)0x4000000000000000;
            local_128.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
            local_128.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8;
            Disa::Vector_Dense<double,_0UL>::Vector_Dense
                      ((Vector_Dense<double,_0UL> *)local_1f8,(initializer_list<double> *)&local_128
                      );
            local_e8._M_array = (iterator)0x4008000000000000;
            local_e8._M_len = 0x4010000000000000;
            local_c0 = 2;
            local_d8._16_8_ = &local_e8;
            Disa::Vector_Dense<double,_0UL>::Vector_Dense
                      ((Vector_Dense<double,_0UL> *)(local_1e8 + 8),
                       (initializer_list<double> *)(local_d8 + 0x10));
            local_40._M_array = local_58;
            local_58[0] = 5.0;
            local_58[1] = 6.0;
            local_40._M_len = 2;
            Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_1c8,&local_40);
            local_188.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
            local_188.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (Vector_Dense<double,_0UL> *)local_1f8;
            Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
                      ((Matrix_Dense<double,_0UL,_0UL> *)&local_218,
                       (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)&local_188);
            local_228 = local_1a8.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_238._8_8_ =
                 local_1a8.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_238._0_8_ =
                 local_1a8.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1a8.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_218.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1a8.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_218.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1a8.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_218.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::~vector((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                       *)local_238);
            std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::~vector(&local_218);
            lVar13 = 0x48;
            do {
              pvVar2 = *(void **)((long)&local_218.
                                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + lVar13);
              if (pvVar2 != (void *)0x0) {
                operator_delete(pvVar2,*(long *)((long)&lStack_200 + lVar13) - (long)pvVar2);
              }
              lVar13 = lVar13 + -0x18;
            } while (lVar13 != 0);
            local_228 = (pointer)0x4022000000000000;
            uStack_220 = 0x4024000000000000;
            local_238._0_8_ =
                 (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )0x401c000000000000;
            local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4020000000000000;
            local_c0 = 4;
            local_d8._16_8_ = local_238;
            Disa::Vector_Dense<double,_0UL>::Vector_Dense
                      ((Vector_Dense<double,_0UL> *)local_1f8,
                       (initializer_list<double> *)(local_d8 + 0x10));
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x402a000000000000;
            lStack_200 = 0x402c000000000000;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4026000000000000;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4028000000000000;
            local_e8._M_len = 4;
            local_e8._M_array = (iterator)&local_218;
            Disa::Vector_Dense<double,_0UL>::Vector_Dense
                      ((Vector_Dense<double,_0UL> *)(local_1e8 + 8),&local_e8);
            local_d8._8_8_ = (pointer)0x2;
            local_d8._0_8_ = (Vector_Dense<double,_0UL> *)local_1f8;
            Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
                      ((Matrix_Dense<double,_0UL,_0UL> *)&local_128,
                       (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)local_d8);
            local_188.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_148.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_188.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_148.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_188.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_148.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_148.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_128.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_148.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_128.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_148.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_128.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_128.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_128.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::~vector(&local_188);
            std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::~vector(&local_128);
            lVar13 = 0x30;
            do {
              pvVar2 = *(void **)((long)&local_218.
                                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + lVar13);
              if (pvVar2 != (void *)0x0) {
                operator_delete(pvVar2,*(long *)((long)&lStack_200 + lVar13) - (long)pvVar2);
              }
              lVar13 = lVar13 + -0x18;
            } while (lVar13 != 0);
            Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                      ((Matrix_Dense<double,0ul,0ul> *)&local_1a8,
                       (Matrix_Dense<double,_0UL,_0UL> *)&local_148);
            local_238._0_8_ =
                 ((long)local_1a8.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1a8.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_218.
                                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
            testing::internal::CmpHelperEQ<unsigned_long,int>
                      ((internal *)local_1f8,"dynamic_matrix_0.size_row()","3",
                       (unsigned_long *)local_238,(int *)&local_218);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x116,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            if (local_1a8.
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_1a8.
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_238._0_8_ =
                   (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    )0x0;
            }
            else {
              local_238._0_8_ =
                   (long)((local_1a8.
                           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<double,_std::allocator<double>_>).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)((local_1a8.
                           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<double,_std::allocator<double>_>).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
            }
            local_218.
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_218.
                                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
            testing::internal::CmpHelperEQ<unsigned_long,int>
                      ((internal *)local_1f8,"dynamic_matrix_0.size_column()","4",
                       (unsigned_long *)local_238,(int *)&local_218);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x117,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[0][0]","29",
                       *((local_1a8.
                          super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<double,_std::allocator<double>_>).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,29.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x118,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )local_238._0_8_ !=
                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[0][1]","32",
                       ((local_1a8.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[1],32.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x119,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[0][2]","35",
                       ((local_1a8.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[2],35.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x11a,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[0][3]","38",
                       ((local_1a8.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[3],38.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x11b,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[1][0]","65",
                       *local_1a8.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,65.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x11c,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[1][1]","72",
                       *(double *)
                        ((long)local_1a8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].
                               super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 8),72.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x11d,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[1][2]","79",
                       *(double *)
                        ((long)local_1a8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].
                               super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x10),79.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x11e,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[1][3]","86",
                       *(double *)
                        ((long)local_1a8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].
                               super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x18),86.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x11f,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[2][0]","101",
                       *local_1a8.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].
                        super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,101.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x120,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[2][1]","112",
                       *(double *)
                        ((long)local_1a8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].
                               super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 8),112.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x121,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[2][2]","123",
                       *(double *)
                        ((long)local_1a8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].
                               super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x10),123.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x122,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)local_1f8,"dynamic_matrix_0[2][3]","134",
                       *(double *)
                        ((long)local_1a8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].
                               super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x18),134.0);
            if (local_1f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_238);
              if (pbStack_1f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = (pbStack_1f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x123,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)((long)*(double *)local_238._0_8_ + 8))();
              }
            }
            if (pbStack_1f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_1f0,pbStack_1f0);
            }
            Disa::Matrix_Dense<double,_0UL,_0UL>::resize
                      ((Matrix_Dense<double,_0UL,_0UL> *)&local_1a8,1,1);
            local_1d8 = 0.0;
            dStack_1d0 = 0.0;
            local_1e8._0_8_ = (pointer)0x0;
            local_1e8._8_8_ = 0.0;
            local_1f8 = (undefined1  [8])0x0;
            pbStack_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            bVar6 = testing::internal::AlwaysTrue();
            if (bVar6) {
              local_218.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x161492;
              testing::ContainsRegex<char_const*>
                        ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_238,
                         (testing *)&local_218,regex);
              testing::PolymorphicMatcher::operator_cast_to_Matcher
                        ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&local_70,(PolymorphicMatcher *)local_238);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
              }
              bVar6 = testing::internal::DeathTest::Create
                                ("dynamic_matrix_1 *= incorrect",
                                 (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)&local_70,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                                 ,0x127,(DeathTest **)&local_188);
              testing::internal::
              MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase(&local_70);
              pbVar15 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_188.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (!bVar6) goto LAB_00115da7;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_188.
                  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                iVar8 = (**(code **)((long)*(double *)
                                            local_188.
                                            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 0x10))
                                  (local_188.
                                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                pVVar4 = local_188.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (iVar8 == 0) {
                  iVar8 = (**(code **)((long)*(double *)
                                              local_188.
                                              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 0x18))
                                    (local_188.
                                     super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  bVar6 = testing::internal::ExitedUnsuccessfully(iVar8);
                  cVar7 = (**(code **)((long)*(double *)pVVar4 + 0x20))(pVVar4,bVar6);
                  if (cVar7 == '\0') {
                    (**(code **)((long)*(double *)pbVar15 + 8))(pbVar15);
                    goto LAB_00115da7;
                  }
                }
                else if (iVar8 == 1) {
                  bVar6 = testing::internal::AlwaysTrue();
                  if (bVar6) {
                    Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                              ((Matrix_Dense<double,0ul,0ul> *)&local_148,
                               (Matrix_Dense<double,_2UL,_3UL> *)local_1f8);
                  }
                  (**(code **)((long)*(double *)
                                      local_188.
                                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0x28))
                            (local_188.
                             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,2);
                  (**(code **)((long)*(double *)pVVar4 + 0x28))(pVVar4,0);
                }
                dVar10 = *(double *)pbVar15;
                goto LAB_00115df5;
              }
            }
            else {
LAB_00115da7:
              testing::Message::Message((Message *)local_238);
              pcVar9 = testing::internal::DeathTest::LastMessage();
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x127,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                dVar10 = *(double *)local_238._0_8_;
                pbVar15 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )local_238._0_8_;
LAB_00115df5:
                (**(code **)((long)dVar10 + 8))(pbVar15);
              }
            }
            bVar6 = testing::internal::AlwaysTrue();
            if (bVar6) {
              local_218.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x161492;
              testing::ContainsRegex<char_const*>
                        ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_238,
                         (testing *)&local_218,regex_00);
              testing::PolymorphicMatcher::operator_cast_to_Matcher
                        ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&local_88,(PolymorphicMatcher *)local_238);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
              }
              bVar6 = testing::internal::DeathTest::Create
                                ("dynamic_matrix_1 *= dynamic_matrix_0",
                                 (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)&local_88,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                                 ,0x128,(DeathTest **)&local_188);
              testing::internal::
              MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase(&local_88);
              pbVar15 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_188.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (!bVar6) goto LAB_00115f1c;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_188.
                  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                iVar8 = (**(code **)((long)*(double *)
                                            local_188.
                                            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 0x10))
                                  (local_188.
                                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                pVVar4 = local_188.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (iVar8 == 0) {
                  iVar8 = (**(code **)((long)*(double *)
                                              local_188.
                                              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 0x18))
                                    (local_188.
                                     super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  bVar6 = testing::internal::ExitedUnsuccessfully(iVar8);
                  cVar7 = (**(code **)((long)*(double *)pVVar4 + 0x20))(pVVar4,bVar6);
                  if (cVar7 == '\0') {
                    (**(code **)((long)*(double *)pbVar15 + 8))(pbVar15);
                    goto LAB_00115f1c;
                  }
                }
                else if (iVar8 == 1) {
                  bVar6 = testing::internal::AlwaysTrue();
                  if (bVar6) {
                    Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                              ((Matrix_Dense<double,0ul,0ul> *)&local_148,
                               (Matrix_Dense<double,_0UL,_0UL> *)&local_1a8);
                  }
                  (**(code **)((long)*(double *)
                                      local_188.
                                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0x28))
                            (local_188.
                             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,2);
                  (**(code **)((long)*(double *)pVVar4 + 0x28))(pVVar4,0);
                }
                dVar10 = *(double *)pbVar15;
                goto LAB_00115f6a;
              }
            }
            else {
LAB_00115f1c:
              testing::Message::Message((Message *)local_238);
              pcVar9 = testing::internal::DeathTest::LastMessage();
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x128,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                dVar10 = *(double *)local_238._0_8_;
                pbVar15 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )local_238._0_8_;
LAB_00115f6a:
                (**(code **)((long)dVar10 + 8))(pbVar15);
              }
            }
            bVar6 = testing::internal::AlwaysTrue();
            if (bVar6) {
              local_218.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x161492;
              testing::ContainsRegex<char_const*>
                        ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_238,
                         (testing *)&local_218,regex_01);
              testing::PolymorphicMatcher::operator_cast_to_Matcher
                        ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&local_a0,(PolymorphicMatcher *)local_238);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
              }
              bVar6 = testing::internal::DeathTest::Create
                                ("static_matrix_0 *= incorrect",
                                 (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)&local_a0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                                 ,0x129,(DeathTest **)&local_188);
              testing::internal::
              MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase(&local_a0);
              pbVar15 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_188.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (!bVar6) goto LAB_0011608e;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_188.
                  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                iVar8 = (**(code **)((long)*(double *)
                                            local_188.
                                            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 0x10))
                                  (local_188.
                                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                pVVar4 = local_188.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (iVar8 == 0) {
                  iVar8 = (**(code **)((long)*(double *)
                                              local_188.
                                              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 0x18))
                                    (local_188.
                                     super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  bVar6 = testing::internal::ExitedUnsuccessfully(iVar8);
                  cVar7 = (**(code **)((long)*(double *)pVVar4 + 0x20))(pVVar4,bVar6);
                  if (cVar7 == '\0') {
                    (**(code **)((long)*(double *)pbVar15 + 8))(pbVar15);
                    goto LAB_0011608e;
                  }
                }
                else if (iVar8 == 1) {
                  bVar6 = testing::internal::AlwaysTrue();
                  if (bVar6) {
                    Disa::Matrix_Dense<double,2ul,2ul>::operator*=
                              ((Matrix_Dense<double,2ul,2ul> *)&local_168,
                               (Matrix_Dense<double,_2UL,_3UL> *)local_1f8);
                  }
                  (**(code **)((long)*(double *)
                                      local_188.
                                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0x28))
                            (local_188.
                             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,2);
                  (**(code **)((long)*(double *)pVVar4 + 0x28))(pVVar4,0);
                }
                dVar10 = *(double *)pbVar15;
                goto LAB_001160dc;
              }
            }
            else {
LAB_0011608e:
              testing::Message::Message((Message *)local_238);
              pcVar9 = testing::internal::DeathTest::LastMessage();
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x129,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_238._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                dVar10 = *(double *)local_238._0_8_;
                pbVar15 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )local_238._0_8_;
LAB_001160dc:
                (**(code **)((long)dVar10 + 8))(pbVar15);
              }
            }
            bVar6 = testing::internal::AlwaysTrue();
            if (bVar6) {
              local_218.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x161492;
              testing::ContainsRegex<char_const*>
                        ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_238,
                         (testing *)&local_218,regex_02);
              testing::PolymorphicMatcher::operator_cast_to_Matcher
                        ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&local_b8,(PolymorphicMatcher *)local_238);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
              }
              bVar6 = testing::internal::DeathTest::Create
                                ("static_matrix_0 *= dynamic_matrix_0",
                                 (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)&local_b8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                                 ,0x12a,(DeathTest **)&local_188);
              testing::internal::
              MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase(&local_b8);
              pbVar15 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_188.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (!bVar6) goto LAB_00116203;
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_188.
                  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
              goto LAB_00116254;
              iVar8 = (**(code **)((long)*(double *)
                                          local_188.
                                          super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 0x10))
                                (local_188.
                                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              pVVar4 = local_188.
                       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (iVar8 == 0) {
                iVar8 = (**(code **)((long)*(double *)
                                            local_188.
                                            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 0x18))
                                  (local_188.
                                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                bVar6 = testing::internal::ExitedUnsuccessfully(iVar8);
                cVar7 = (**(code **)((long)*(double *)pVVar4 + 0x20))(pVVar4,bVar6);
                if (cVar7 == '\0') {
                  (**(code **)((long)*(double *)pbVar15 + 8))(pbVar15);
                  goto LAB_00116203;
                }
              }
              else if (iVar8 == 1) {
                bVar6 = testing::internal::AlwaysTrue();
                if (bVar6) {
                  Disa::Matrix_Dense<double,2ul,2ul>::operator*=
                            ((Matrix_Dense<double,2ul,2ul> *)&local_168,
                             (Matrix_Dense<double,_0UL,_0UL> *)&local_1a8);
                }
                (**(code **)((long)*(double *)
                                    local_188.
                                    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 0x28))
                          (local_188.
                           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,2);
                (**(code **)((long)*(double *)pVVar4 + 0x28))(pVVar4,0);
              }
              dVar10 = *(double *)pbVar15;
            }
            else {
LAB_00116203:
              testing::Message::Message((Message *)local_238);
              pcVar9 = testing::internal::DeathTest::LastMessage();
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_218,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                         ,0x12a,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_218,(Message *)local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_238._0_8_ ==
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
              goto LAB_00116254;
              dVar10 = *(double *)local_238._0_8_;
              pbVar15 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_238._0_8_;
            }
            (**(code **)((long)dVar10 + 8))(pbVar15);
LAB_00116254:
            std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::~vector(&local_148);
            std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::~vector(&local_1a8);
            return;
          }
          goto LAB_001143e3;
        }
      }
      (&piVar14->_M_array)[lVar16] =
           (iterator)
           ((pVVar18->super_array<double,_2UL>)._M_elems[0] * (double)piVar17->_M_array + 0.0);
      lVar16 = 1;
      piVar17 = piVar1;
      bVar5 = false;
    } while (bVar3);
    bVar11 = false;
    piVar12 = (initializer_list<double> *)
              (local_108.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems + 1);
    lVar13 = 1;
  } while( true );
}

Assistant:

TEST(test_matrix_dense, matrix_matrix_multiplication_assignment) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_1 = {{5, 6}, {7, 8}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_1 = {{5, 6}, {7, 8}};

  dynamic_matrix_0 *= dynamic_matrix_1;
  static_matrix_0 *= static_matrix_1;
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 50);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][1], 50);

  // reset
  dynamic_matrix_0 = {{1, 2}, {3, 4}};
  static_matrix_0 = {{1, 2}, {3, 4}};
  dynamic_matrix_0 *= static_matrix_1;
  static_matrix_0 *= dynamic_matrix_1;
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 50);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][1], 50);

  // non-square
  dynamic_matrix_0 = {{1, 2}, {3, 4}, {5, 6}};
  dynamic_matrix_1 = {{7, 8, 9, 10}, {11, 12, 13, 14}};
  dynamic_matrix_0 *= dynamic_matrix_1;
  EXPECT_EQ(dynamic_matrix_0.size_row(), 3);
  EXPECT_EQ(dynamic_matrix_0.size_column(), 4);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 29);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 32);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][2], 35);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][3], 38);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 65);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 72);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][2], 79);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][3], 86);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][0], 101);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][1], 112);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][2], 123);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][3], 134);

  dynamic_matrix_0.resize(1, 1);
  Matrix_Dense<Scalar, 2, 3> incorrect;
  EXPECT_DEATH(dynamic_matrix_1 *= incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_1 *= dynamic_matrix_0, "./*");
  EXPECT_DEATH(static_matrix_0 *= incorrect, "./*");
  EXPECT_DEATH(static_matrix_0 *= dynamic_matrix_0, "./*");
}